

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void ngai_acc_common(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                    Integer *nbhandle)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *dst_ptr;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  armci_hdl_t *nb_handle;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *src_ptr;
  Integer *nbhandle_00;
  short sVar14;
  double dVar15;
  int proc;
  int local_440;
  uint local_43c;
  ulong local_438;
  Integer *phi;
  Integer *plo;
  long local_420;
  void *local_418;
  char *prem;
  int count [7];
  int stride_loc [7];
  int stride_rem [7];
  Integer ga_nbhandle;
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  
  lVar8 = g_a + 1000;
  local_418 = alpha;
  if ((g_a < -1000) || (_max_global_array <= lVar8)) {
    sprintf((char *)&it_hdl,"%s: INVALID ARRAY HANDLE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  if (GA[lVar8].actv == 0) {
    sprintf((char *)&it_hdl,"%s: ARRAY NOT ACTIVE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  iVar1 = GA[lVar8].elemsize;
  sVar14 = GA[lVar8].ndim;
  uVar4 = GA[lVar8].type - 0x3e9;
  if ((uVar4 < 7) && ((0x6fU >> (uVar4 & 0x1f) & 1) != 0)) {
    local_440 = *(int *)(&DAT_001ba598 + (ulong)uVar4 * 4);
  }
  else {
    pnga_error("type not supported",(long)GA[lVar8].type);
    local_440 = -1;
  }
  lVar8 = (long)(int)sVar14;
  gai_iterator_init(g_a,lo,hi,&it_hdl);
  dVar15 = 1.0;
  uVar13 = (ulong)(uint)(int)sVar14;
  if (0 < sVar14) {
    lVar9 = 1;
    uVar11 = 0;
    do {
      lVar9 = lVar9 * ((hi[uVar11] - lo[uVar11]) + 1);
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
    dVar15 = (double)lVar9;
  }
  GAbytes.acctot = dVar15 * (double)iVar1 + GAbytes.acctot;
  GAstat.numacc = GAstat.numacc + 1;
  nbhandle_00 = &ga_nbhandle;
  if (nbhandle != (Integer *)0x0) {
    nbhandle_00 = nbhandle;
  }
  ga_init_nbhandle(nbhandle_00);
  uVar11 = lVar8 - 1;
  local_438 = uVar11 & 0xffffffff;
  local_43c = (uint)CONCAT71((int7)(local_438 >> 8),1);
  local_420 = lVar8;
  do {
    gai_iterator_reset(&it_hdl);
    while (iVar5 = gai_iterator_next(&it_hdl,&proc,&plo,&phi,&prem,ldrem), iVar5 != 0) {
      uVar6 = armci_domain_same_id(0,proc);
      dst_ptr = prem;
      iVar5 = proc;
      uVar4 = (uint)(uVar6 == 0);
      if ((local_43c & 1) == 0) {
        uVar4 = uVar6;
      }
      if (uVar4 != 0) {
        lVar9 = *plo - *lo;
        sVar14 = (short)lVar8;
        if (1 < sVar14) {
          lVar8 = 1;
          uVar12 = 0;
          do {
            lVar8 = lVar8 * ld[uVar12];
            lVar2 = uVar12 + 1;
            lVar3 = uVar12 + 1;
            uVar12 = uVar12 + 1;
            lVar9 = lVar9 + (plo[lVar2] - lo[lVar3]) * lVar8;
          } while (uVar11 != uVar12);
        }
        stride_loc[0] = iVar1;
        stride_rem[0] = iVar1;
        if (sVar14 < 1) {
          count[0] = count[0] * iVar1;
        }
        else {
          uVar12 = 0;
          do {
            count[uVar12] = ((int)phi[uVar12] - (int)plo[uVar12]) + 1;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          count[0] = count[0] * iVar1;
          if (1 < sVar14) {
            uVar12 = 0;
            iVar10 = iVar1;
            iVar7 = iVar1;
            do {
              iVar10 = iVar10 * (int)ldrem[uVar12];
              stride_rem[uVar12] = iVar10;
              iVar7 = iVar7 * (int)ld[uVar12];
              stride_loc[uVar12] = iVar7;
              stride_rem[uVar12 + 1] = iVar10;
              stride_loc[uVar12 + 1] = iVar7;
              uVar12 = uVar12 + 1;
            } while (local_438 != uVar12);
          }
        }
        if (GA_fence_set != 0) {
          fence_array[proc] = '\x01';
        }
        if (GAme == proc) {
          dVar15 = 1.0;
          if (0 < sVar14) {
            lVar8 = 1;
            uVar12 = 0;
            do {
              lVar8 = lVar8 * ((phi[uVar12] - plo[uVar12]) + 1);
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
            dVar15 = (double)lVar8;
          }
          GAbytes.accloc = dVar15 * (double)iVar1 + GAbytes.accloc;
        }
        src_ptr = (void *)(lVar9 * iVar1 + (long)buf);
        if (nbhandle == (Integer *)0x0) {
          ARMCI_AccS(local_440,local_418,src_ptr,stride_loc,prem,stride_rem,count,(int)local_438,
                     proc);
          lVar8 = local_420;
        }
        else {
          nb_handle = get_armci_nbhandle(nbhandle);
          ARMCI_NbAccS(local_440,local_418,src_ptr,stride_loc,dst_ptr,stride_rem,count,
                       (int)local_438,iVar5,nb_handle);
          lVar8 = local_420;
        }
      }
    }
    uVar4 = local_43c & 1;
    local_43c = 0;
  } while (uVar4 != 0);
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void ngai_acc_common(Integer g_a,
                   Integer *lo,
                   Integer *hi,
                   void    *buf,
                   Integer *ld,
                   void    *alpha,
                   Integer *nbhandle)
{
  Integer  p, np=0, handle=GA_OFFSET + g_a;
  Integer  idx, elems, size, type, p_handle, ga_nbhandle;
  int optype=-1, loop, ndim, cond;
  int proc;
  int num_loops=2; /* 1st loop for remote procs; 2nd loop for local procs */
  Integer n_rstrctd;
  Integer *rank_rstrctd;
  _iterator_hdl it_hdl;

  GA_Internal_Threadsafe_Lock();

  ga_check_handleM(g_a, "ngai_acc_common");

  size = GA[handle].elemsize;
  type = GA[handle].type;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  n_rstrctd = (Integer)GA[handle].num_rstrctd;
  rank_rstrctd = GA[handle].rank_rstrctd;

  if(type==C_DBL) optype= ARMCI_ACC_DBL;
  else if(type==C_FLOAT) optype= ARMCI_ACC_FLT;
  else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
  else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
  else if(type==C_INT)optype= ARMCI_ACC_INT;
  else if(type==C_LONG)optype= ARMCI_ACC_LNG;
  else pnga_error("type not supported",type);

  gai_iterator_init(g_a, lo, hi, &it_hdl);

#ifndef NO_GA_STATS
  gam_CountElems(ndim, lo, hi, &elems);
  GAbytes.acctot += (double)size*elems;
  GAstat.numacc++;
  GAstat.numacc_procs += np;
#endif

  if(nbhandle)ga_init_nbhandle(nbhandle);
  else ga_init_nbhandle(&ga_nbhandle);

#ifdef PROFILE_OLD
  ga_profile_start((int)handle, (long)size*elems, ndim, lo, hi,
      ENABLE_PROFILE_ACC);
#endif

  for(loop=0; loop<num_loops; loop++) {
    Integer ldrem[MAXDIM];
    int stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
    Integer idx_buf, *plo, *phi;
    char *pbuf, *prem;
    gai_iterator_reset(&it_hdl);

    while (gai_iterator_next(&it_hdl, &proc, &plo, &phi, &prem, ldrem)) {

      /* check if it is local to SMP */
      cond = armci_domain_same_id(ARMCI_DOMAIN_SMP,(int)proc);
      if(loop==0) cond = !cond;

      if(cond) {

        /* find the right spot in the user buffer */
        gam_ComputePatchIndex(ndim,lo, plo, ld, &idx_buf);
        pbuf = size*idx_buf + (char*)buf;

        gam_ComputeCount(ndim, plo, phi, count);

        /* scale number of rows by element size */
        count[0] *= size;
        gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);

        if(GA_fence_set)fence_array[proc]=1;

#ifndef NO_GA_STATS
        if(proc == GAme){
          gam_CountElems(ndim, plo, phi, &elems);
          GAbytes.accloc += (double)size*elems;
        }
#endif

        if(nbhandle) {
          ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem,
              stride_rem, count, ndim-1, proc,
              (armci_hdl_t*)get_armci_nbhandle(nbhandle));
        } else {
#  if !defined(DISABLE_NBOPT)
          if((loop==0 && gai_iterator_last(&it_hdl)) || loop==1) {
            ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, 
                count, ndim-1, proc);
          } else {
            ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem, 
                stride_rem, count, ndim-1, proc,
                (armci_hdl_t*)get_armci_nbhandle(&ga_nbhandle));
          }
#  else
          ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem,
              count, ndim-1, proc);
#  endif
        }
      } /* end if(cond) */
    }
  }
#if !defined(DISABLE_NBOPT)
  if(!nbhandle) nga_wait_internal(&ga_nbhandle);
#endif

#ifdef PROFILE_OLD
  ga_profile_stop();
#endif
  GA_Internal_Threadsafe_Unlock();

  gai_iterator_destroy(&it_hdl);
}